

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O0

int GetUnformatSizeCode(DataRate datarate)

{
  undefined4 local_c;
  DataRate datarate_local;
  
  if (datarate == _250K) {
    local_c = 6;
  }
  else if (datarate == _300K) {
    local_c = 6;
  }
  else if (datarate == _500K) {
    local_c = 7;
  }
  else if (datarate == _1M) {
    local_c = 8;
  }
  else {
    local_c = 7;
  }
  return local_c;
}

Assistant:

int GetUnformatSizeCode(DataRate datarate)
{
    switch (datarate)
    {
    case DataRate::_250K:   return 6;
    case DataRate::_300K:   return 6;
    case DataRate::_500K:   return 7;
    case DataRate::_1M:     return 8;
    default:                break;
    }

    return 7;
}